

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

CharSetNode * __thiscall
UnifiedRegex::CharSetInner::ClearRange
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17b,"(level > 0)","level > 0");
    if (!bVar4) goto LAB_00e6d4ad;
    *puVar6 = 0;
  }
  cVar3 = (char)level * '\x04';
  uVar12 = ~(-1 << (cVar3 + 8U & 0x1f));
  if (uVar12 < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17c,"(h <= lim(level))",
                       "The range for clearing provided is invalid for this level.");
    if (!bVar4) goto LAB_00e6d4ad;
    *puVar6 = 0;
  }
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17d,"(l <= h)","Can\'t clear where lower is bigger than the higher.");
    if (!bVar4) {
LAB_00e6d4ad:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (uVar12 != h || l != 0) {
    bVar9 = cVar3 + 4;
    uVar14 = l >> (bVar9 & 0x1f) & 0xf;
    uVar15 = (ulong)uVar14;
    uVar13 = h >> (bVar9 & 0x1f) & 0xf;
    uVar8 = (ulong)(level - 1);
    uVar12 = ~(-1 << ((char)level * '\x04' + 4U & 0x1f));
    uVar11 = l & uVar12;
    uVar12 = h & uVar12;
    pCVar1 = this->children[uVar15];
    if (uVar14 == uVar13) {
      if (pCVar1 != (CharSetNode *)0x0) {
        iVar5 = (*pCVar1->_vptr_CharSetNode[3])(pCVar1,allocator,uVar8,(ulong)uVar11,(ulong)uVar12);
        this->children[uVar15] = (CharSetNode *)CONCAT44(extraout_var,iVar5);
      }
    }
    else {
      if (pCVar1 != (CharSetNode *)0x0) {
        iVar5 = (*pCVar1->_vptr_CharSetNode[3])(pCVar1,allocator,uVar8,(ulong)uVar11);
        this->children[uVar15] = (CharSetNode *)CONCAT44(extraout_var_00,iVar5);
      }
      uVar10 = (ulong)uVar13;
      if (uVar14 + 1 < uVar13) {
        do {
          pCVar1 = this->children[uVar15 + 1];
          if (pCVar1 != (CharSetNode *)0x0) {
            (**pCVar1->_vptr_CharSetNode)(pCVar1,allocator);
          }
          this->children[uVar15 + 1] = (CharSetNode *)0x0;
          uVar15 = uVar15 + 1;
        } while (uVar10 - 1 != uVar15);
      }
      pCVar1 = this->children[uVar10];
      if (pCVar1 != (CharSetNode *)0x0) {
        iVar5 = (*pCVar1->_vptr_CharSetNode[3])(pCVar1,allocator,uVar8,0,(ulong)uVar12);
        this->children[uVar10] = (CharSetNode *)CONCAT44(extraout_var_01,iVar5);
      }
    }
    lVar7 = 1;
    do {
      if (this->children[lVar7 + -1] != (CharSetNode *)0x0) {
        return &this->super_CharSetNode;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x11);
  }
  return (CharSetNode *)0x0;
}

Assistant:

CharSetNode* CharSetInner::ClearRange(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level > 0);
        AssertMsg(h <= lim(level), "The range for clearing provided is invalid for this level.");
        AssertMsg(l <= h, "Can't clear where lower is bigger than the higher.");
        if (l == 0 && h == lim(level))
        {
            return nullptr;
        }

        uint lowerIndex = innerIdx(level, l);
        uint higherIndex = innerIdx(level--, h);
        l = l & lim(level);
        h = h & lim(level);
        if (lowerIndex == higherIndex)
        {
            if (children[lowerIndex] != nullptr)
            {
                children[lowerIndex] = children[lowerIndex]->ClearRange(allocator, level, l, h);
            }
        }
        else
        {
            if (children[lowerIndex] != nullptr)
            {
                children[lowerIndex] = children[lowerIndex]->ClearRange(allocator, level, l, lim(level));
            }

            for (uint i = lowerIndex + 1; i < higherIndex; i++)
            {
                if (children[i] != nullptr)
                {
                    children[i]->FreeSelf(allocator);
                }

                children[i] = nullptr;
            }

            if (children[higherIndex] != nullptr)
            {
                children[higherIndex] = children[higherIndex]->ClearRange(allocator, level, 0, h);
            }
        }
        for (int i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != nullptr)
            {
                return this;
            }
        }

        return nullptr;
    }